

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::RenamingSubstitution::output
          (RenamingSubstitution *this,ostream *out)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{ _query: ",10);
  poVar1 = Lib::operator<<(out,&this->_query);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", _result: ",0xb);
  poVar1 = Lib::operator<<(poVar1,&this->_result);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," }",2);
  return;
}

Assistant:

void output(std::ostream& out) const final override
      { out << "{ _query: " << _query << ", _result: " << _result << " }"; }